

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

void __thiscall celero::Statistics<long>::Statistics(Statistics<long> *this)

{
  long lVar1;
  Statistics<long> *this_local;
  
  this->sampleSize = 0;
  this->M1 = 0.0;
  this->M2 = 0.0;
  this->M3 = 0.0;
  this->M4 = 0.0;
  lVar1 = std::numeric_limits<long>::max();
  this->min = lVar1;
  lVar1 = std::numeric_limits<long>::min();
  this->max = lVar1;
  return;
}

Assistant:

Statistics() = default;